

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O3

void __thiscall BMRS<TTA>::PerformLabeling(BMRS<TTA> *this)

{
  Data_Compressed *data_compressed;
  undefined8 uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  Mat1b *pMVar5;
  int *piVar6;
  Mat1i *pMVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint *puVar11;
  int iVar12;
  uint64_t *puVar14;
  long lVar15;
  Run *pRVar16;
  ushort uVar17;
  uint uVar18;
  uint height;
  uint64_t *puVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  uint64_t *puVar24;
  long lVar25;
  long lVar26;
  uint64_t *puVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  uint64_t *puVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Mat local_b8 [96];
  Scalar_ local_58 [16];
  undefined1 local_48 [16];
  uint uVar13;
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar5->field_0x8;
  uVar4 = *(uint *)&pMVar5->field_0xc;
  data_compressed = &this->data_compressed;
  (this->data_compressed).height = iVar3;
  (this->data_compressed).width = uVar4;
  uVar13 = uVar4 + 0x3f;
  if (-1 < (int)uVar4) {
    uVar13 = uVar4;
  }
  iVar12 = (int)uVar13 >> 6;
  iVar21 = iVar12 + 1;
  (this->data_compressed).data_width = iVar21;
  uVar23 = (ulong)(uint)(iVar21 * iVar3) * 8;
  if (iVar21 * iVar3 < 0) {
    uVar23 = 0xffffffffffffffff;
  }
  puVar14 = (uint64_t *)operator_new__(uVar23);
  (this->data_compressed).bits = puVar14;
  InitCompressedData(this,data_compressed);
  uVar18 = iVar3 / 2;
  iVar29 = iVar3 % 2;
  height = uVar18 + iVar29;
  uVar13 = (this->data_compressed).data_width;
  lVar15 = (long)(int)uVar13;
  (this->data_merged).height = height;
  (this->data_merged).width = uVar4;
  (this->data_merged).data_width = iVar21;
  uVar23 = (ulong)(height * iVar21) * 8;
  if ((int)(height * iVar21) < 0) {
    uVar23 = 0xffffffffffffffff;
  }
  puVar14 = (uint64_t *)operator_new__(uVar23);
  (this->data_merged).bits = puVar14;
  if (1 < iVar3) {
    puVar19 = data_compressed->bits;
    puVar24 = puVar19 + lVar15;
    uVar23 = 0;
    puVar27 = puVar14;
    do {
      if (0 < (int)uVar13) {
        uVar28 = 0;
        do {
          puVar27[uVar28] = puVar24[uVar28] | puVar19[uVar28];
          uVar28 = uVar28 + 1;
        } while (uVar13 != uVar28);
      }
      uVar23 = uVar23 + 1;
      puVar27 = puVar27 + (long)iVar12 + 1;
      puVar24 = puVar24 + lVar15 * 2;
      puVar19 = puVar19 + lVar15 * 2;
    } while (uVar23 != uVar18);
  }
  if ((iVar29 != 0) && (0 < (int)uVar13)) {
    puVar24 = data_compressed->bits;
    uVar23 = 0;
    do {
      puVar14[(long)(int)uVar18 * (long)iVar21 + uVar23] = puVar24[(iVar3 + -1) * lVar15 + uVar23];
      uVar23 = uVar23 + 1;
    } while (uVar13 != uVar23);
  }
  uVar30 = height - 1;
  (this->data_flags).height = uVar30;
  (this->data_flags).width = uVar4;
  (this->data_flags).data_width = iVar21;
  uVar23 = 0xffffffffffffffff;
  if (-1 < (int)(iVar21 * uVar30)) {
    uVar23 = (ulong)(iVar21 * uVar30) * 8;
  }
  puVar14 = (uint64_t *)operator_new__(uVar23);
  (this->data_flags).bits = puVar14;
  if (1 < (int)height) {
    puVar19 = data_compressed->bits;
    puVar24 = puVar19 + lVar15;
    uVar23 = 0;
    puVar31 = puVar14;
    puVar27 = puVar19;
    do {
      puVar27 = puVar27 + lVar15 * 2;
      puVar14[uVar23 * (long)iVar21] =
           (puVar19[(uVar23 * 2 + 2) * lVar15] * 2 | puVar19[(uVar23 * 2 + 2) * lVar15]) &
           (puVar19[(uVar23 * 2 + 1) * lVar15] * 2 | puVar19[(uVar23 * 2 + 1) * lVar15]);
      if (1 < (int)uVar13) {
        uVar28 = 1;
        do {
          puVar31[uVar28] =
               (puVar27[uVar28 - 1] >> 0x3f | puVar27[uVar28] << 1 | puVar27[uVar28]) &
               (puVar24[uVar28 - 1] >> 0x3f | puVar24[uVar28] << 1 | puVar24[uVar28]);
          uVar28 = uVar28 + 1;
        } while (uVar13 != uVar28);
      }
      uVar23 = uVar23 + 1;
      puVar31 = puVar31 + (long)iVar12 + 1;
      puVar24 = puVar24 + lVar15 * 2;
    } while (uVar23 != uVar30);
  }
  (this->data_runs).height = height;
  (this->data_runs).width = uVar4;
  pRVar16 = (Run *)operator_new__((ulong)(((uVar4 >> 1) + 2) * height + 1) << 3);
  (this->data_runs).runs = pRVar16;
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  FindRuns(this,(this->data_merged).bits,(this->data_flags).bits,height,uVar13,
           (this->data_runs).runs);
  piVar6 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar6,piVar6[1],4);
  local_48 = (undefined1  [16])0x0;
  local_58[0] = (Scalar_)0x0;
  local_58[1] = (Scalar_)0x0;
  local_58[2] = (Scalar_)0x0;
  local_58[3] = (Scalar_)0x0;
  local_58[4] = (Scalar_)0x0;
  local_58[5] = (Scalar_)0x0;
  local_58[6] = (Scalar_)0x0;
  local_58[7] = (Scalar_)0x0;
  local_58[8] = (Scalar_)0x0;
  local_58[9] = (Scalar_)0x0;
  local_58[10] = (Scalar_)0x0;
  local_58[0xb] = (Scalar_)0x0;
  local_58[0xc] = (Scalar_)0x0;
  local_58[0xd] = (Scalar_)0x0;
  local_58[0xe] = (Scalar_)0x0;
  local_58[0xf] = (Scalar_)0x0;
  cv::Mat::operator=(local_b8,local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  puVar11 = TTA::rtable_;
  pRVar16 = (this->data_runs).runs;
  if (1 < iVar3) {
    pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    puVar14 = (this->data_compressed).bits;
    lVar22 = *(long *)&pMVar7->field_0x10;
    lVar26 = **(long **)&pMVar7->field_0x48;
    lVar15 = lVar22 + lVar26;
    lVar26 = lVar26 * 2;
    uVar23 = 0;
    do {
      uVar17 = pRVar16->start_pos;
      if (uVar17 != 0xffff) {
        iVar12 = (this->data_compressed).data_width;
        iVar21 = (int)uVar23 * iVar12;
        do {
          uVar2 = pRVar16->end_pos;
          if (uVar17 < uVar2) {
            uVar4 = puVar11[pRVar16->label];
            uVar28 = (ulong)uVar17;
            do {
              uVar20 = uVar28 >> 6 & 0x3ffffff;
              if ((puVar14[(long)(iVar21 * 2) + uVar20] >> (uVar28 & 0x3f) & 1) != 0) {
                *(uint *)(lVar22 + uVar28 * 4) = uVar4;
              }
              if ((puVar14[(long)(iVar21 * 2) + (long)iVar12 + uVar20] & 1L << ((byte)uVar28 & 0x3f)
                  ) != 0) {
                *(uint *)(lVar15 + uVar28 * 4) = uVar4;
              }
              uVar28 = uVar28 + 1;
            } while (uVar2 != uVar28);
          }
          uVar17 = pRVar16[1].start_pos;
          pRVar16 = pRVar16 + 1;
        } while (uVar17 != 0xffff);
      }
      pRVar16 = pRVar16 + 1;
      uVar23 = uVar23 + 1;
      lVar15 = lVar15 + lVar26;
      lVar22 = lVar22 + lVar26;
    } while (uVar23 != uVar18);
  }
  puVar11 = TTA::rtable_;
  auVar10 = _DAT_00328440;
  auVar9 = _DAT_00328430;
  auVar8 = _DAT_00328420;
  if ((iVar29 != 0) && (uVar17 = pRVar16->start_pos, uVar17 != 0xffff)) {
    pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar15 = *(long *)&pMVar7->field_0x10;
    lVar22 = **(long **)&pMVar7->field_0x48;
    do {
      if (uVar17 < pRVar16->end_pos) {
        uVar4 = puVar11[pRVar16->label];
        lVar25 = (ulong)pRVar16->end_pos - (ulong)uVar17;
        lVar26 = lVar25 + -1;
        auVar32._8_4_ = (int)lVar26;
        auVar32._0_8_ = lVar26;
        auVar32._12_4_ = (int)((ulong)lVar26 >> 0x20);
        lVar26 = lVar15 + (iVar3 + -1) * lVar22 + 0xc + (ulong)uVar17 * 4;
        auVar32 = auVar32 ^ auVar10;
        uVar23 = 0;
        do {
          auVar33._8_4_ = (int)uVar23;
          auVar33._0_8_ = uVar23;
          auVar33._12_4_ = (int)(uVar23 >> 0x20);
          auVar34 = (auVar33 | auVar9) ^ auVar10;
          iVar12 = auVar32._4_4_;
          if ((bool)(~(iVar12 < auVar34._4_4_ ||
                      auVar32._0_4_ < auVar34._0_4_ && auVar34._4_4_ == iVar12) & 1)) {
            *(uint *)(lVar26 + -0xc + uVar23 * 4) = uVar4;
          }
          if (auVar34._12_4_ <= auVar32._12_4_ &&
              (auVar34._8_4_ <= auVar32._8_4_ || auVar34._12_4_ != auVar32._12_4_)) {
            *(uint *)(lVar26 + -8 + uVar23 * 4) = uVar4;
          }
          auVar33 = (auVar33 | auVar8) ^ auVar10;
          iVar21 = auVar33._4_4_;
          if (iVar21 <= iVar12 && (iVar21 != iVar12 || auVar33._0_4_ <= auVar32._0_4_)) {
            *(uint *)(lVar26 + -4 + uVar23 * 4) = uVar4;
            *(uint *)(lVar26 + uVar23 * 4) = uVar4;
          }
          uVar23 = uVar23 + 4;
        } while ((lVar25 + 3U & 0xfffffffffffffffc) != uVar23);
      }
      uVar17 = pRVar16[1].start_pos;
      pRVar16 = pRVar16 + 1;
    } while (uVar17 != 0xffff);
  }
  TTA::Dealloc();
  pRVar16 = (this->data_runs).runs;
  if (pRVar16 != (Run *)0x0) {
    operator_delete__(pRVar16);
  }
  puVar14 = (this->data_flags).bits;
  if (puVar14 != (uint64_t *)0x0) {
    operator_delete__(puVar14);
  }
  puVar14 = (this->data_merged).bits;
  if (puVar14 != (uint64_t *)0x0) {
    operator_delete__(puVar14);
  }
  if (data_compressed->bits != (uint64_t *)0x0) {
    operator_delete__(data_compressed->bits);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        data_merged.Alloc(h_merge, w);
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        data_flags.Alloc(h_merge - 1, w);
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        //find runs
        data_runs.Alloc(h_merge, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);

        img_labels_ = cv::Mat1i(img_.size(), 0);    // (0-init)

        // New version (uses 1-byte per pixel input)
        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (int j = start_pos; j < end_pos; j++) {
                    if (data_u[j >> 6] & (1ull << (j & 0x3F))) labels_u[j] = label;
                    if (data_d[j >> 6] & (1ull << (j & 0x3F))) labels_d[j] = label;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) {
                    labels[j] = label;
                }
            }
        }


        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
    }